

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInteger64StateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Integer64StateQueryTests::init
          (Integer64StateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  StateVerifier *pSVar2;
  Context *pCVar3;
  undefined *puVar4;
  undefined **ppuVar5;
  int iVar6;
  GetBooleanVerifier *this_00;
  undefined4 extraout_var;
  GetIntegerVerifier *this_01;
  undefined4 extraout_var_00;
  GetFloatVerifier *this_02;
  undefined4 extraout_var_01;
  MaxCombinedStageUniformComponentsCase *pMVar7;
  long lVar8;
  long lVar9;
  allocator<char> local_b9;
  MaxCombinedStageUniformComponentsCase *local_b8;
  Integer64StateQueryTests *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined **local_88;
  long local_80;
  long local_78;
  StateVerifier *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  GetBooleanVerifier *local_48;
  GetIntegerVerifier *pGStack_40;
  GetFloatVerifier *local_38;
  
  this_00 = (GetBooleanVerifier *)operator_new(0x28);
  iVar6 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  Integer64StateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar6),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierBoolean = this_00;
  this_01 = (GetIntegerVerifier *)operator_new(0x28);
  iVar6 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  Integer64StateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar6),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger = this_01;
  this_02 = (GetFloatVerifier *)operator_new(0x28);
  iVar6 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  Integer64StateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar6),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierFloat = this_02;
  local_48 = this->m_verifierBoolean;
  pGStack_40 = this->m_verifierInteger;
  local_38 = this_02;
  lVar8 = 0;
  local_b0 = this;
  while (lVar8 != 3) {
    local_88 = &PTR_anon_var_dwarf_4e5e83_00c1e710 + lVar8 * 4;
    lVar9 = 0;
    local_80 = lVar8;
    while (ppuVar5 = local_88, lVar9 != 3) {
      pSVar2 = &(&local_48)[lVar9]->super_StateVerifier;
      local_b8 = (MaxCombinedStageUniformComponentsCase *)operator_new(0xb0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,*ppuVar5,&local_b9);
      local_70 = pSVar2;
      std::operator+(&local_a8,&local_68,pSVar2->m_testNamePostfix);
      pMVar7 = local_b8;
      GVar1 = *(GLenum *)(ppuVar5 + 2);
      puVar4 = ppuVar5[3];
      local_78 = lVar9;
      ApiCase::ApiCase(&local_b8->super_ApiCase,pCVar3,local_a8._M_dataplus._M_p,ppuVar5[1]);
      this = local_b0;
      (pMVar7->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00c1e808;
      pMVar7->m_targetName = GVar1;
      *(undefined **)&pMVar7->m_targetMaxUniformComponentsName = puVar4;
      pMVar7->m_verifier = local_70;
      tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pMVar7);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_68);
      lVar9 = local_78 + 1;
    }
    lVar8 = local_80 + 1;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar2 = &(&local_48)[lVar8]->super_StateVerifier;
    pMVar7 = (MaxCombinedStageUniformComponentsCase *)operator_new(0xb0);
    pCVar3 = (local_b0->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"max_combined_vertex_uniform_components",&local_b9);
    local_b8 = pMVar7;
    std::operator+(&local_a8,&local_68,pSVar2->m_testNamePostfix);
    pMVar7 = local_b8;
    anon_unknown_2::MaxCombinedStageUniformComponentsCase::MaxCombinedStageUniformComponentsCase
              (local_b8,pCVar3,pSVar2,local_a8._M_dataplus._M_p,
               "MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS",0x8a31,0x8a2b,0x8b4a);
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_68);
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar2 = &(&local_48)[lVar8]->super_StateVerifier;
    pMVar7 = (MaxCombinedStageUniformComponentsCase *)operator_new(0xb0);
    pCVar3 = (local_b0->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"max_combined_fragment_uniform_components",&local_b9);
    local_b8 = pMVar7;
    std::operator+(&local_a8,&local_68,pSVar2->m_testNamePostfix);
    pMVar7 = local_b8;
    anon_unknown_2::MaxCombinedStageUniformComponentsCase::MaxCombinedStageUniformComponentsCase
              (local_b8,pCVar3,pSVar2,local_a8._M_dataplus._M_p,
               "MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS",0x8a33,0x8a2d,0x8b49);
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pMVar7);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return 3;
}

Assistant:

void Integer64StateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier			(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger64
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLuint64		minValue;
	} implementationLimits[] =
	{
		{ "max_element_index",			"MAX_ELEMENT_INDEX",		GL_MAX_ELEMENT_INDEX,			0x00FFFFFF /*2^24-1*/	},
		{ "max_server_wait_timeout",	"MAX_SERVER_WAIT_TIMEOUT",	GL_MAX_SERVER_WAIT_TIMEOUT,		0						},
		{ "max_uniform_block_size",		"MAX_UNIFORM_BLOCK_SIZE",	GL_MAX_UNIFORM_BLOCK_SIZE,		16384					}
	};

	// \note do not check the values with integer64 verifier as that has already been checked in implementation_limits
	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationLimits); testNdx++)
		FOR_EACH_VERIFIER(verifiers, addChild(new ConstantMinimumValue64TestCase(m_context, verifier, (std::string(implementationLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationLimits[testNdx].description, implementationLimits[testNdx].targetName, implementationLimits[testNdx].minValue)));

	FOR_EACH_VERIFIER(verifiers, addChild(new MaxCombinedStageUniformComponentsCase (m_context, verifier,	(std::string("max_combined_vertex_uniform_components")		+ verifier->getTestNamePostfix()).c_str(),	"MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS,		GL_MAX_VERTEX_UNIFORM_BLOCKS,		GL_MAX_VERTEX_UNIFORM_COMPONENTS)));
	FOR_EACH_VERIFIER(verifiers, addChild(new MaxCombinedStageUniformComponentsCase (m_context, verifier,	(std::string("max_combined_fragment_uniform_components")	+ verifier->getTestNamePostfix()).c_str(),	"MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS,	GL_MAX_FRAGMENT_UNIFORM_BLOCKS,		GL_MAX_FRAGMENT_UNIFORM_COMPONENTS)));
}